

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::operator[](ArgumentParser *this,string_view arg_name)

{
  bool bVar1;
  char __c;
  reference pAVar2;
  const_reference pvVar3;
  pointer ppVar4;
  logic_error *this_00;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  _Self local_120;
  key_type local_118;
  _Base_ptr local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  int local_dc;
  _Self local_d8;
  key_type local_d0;
  _Base_ptr local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string prefix;
  char legal_prefix_char;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string name;
  _Self local_30;
  const_iterator it;
  ArgumentParser *this_local;
  string_view arg_name_local;
  
  arg_name_local._M_len = (size_t)arg_name._M_str;
  this_local = (ArgumentParser *)arg_name._M_len;
  it._M_node = (_Base_ptr)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::find(&this->m_argument_map,(key_type *)&this_local);
  name.field_2._8_8_ =
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::end(&this->m_argument_map);
  bVar1 = std::operator!=(&local_30,(_Self *)((long)&name.field_2 + 8));
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
             ::operator->(&local_30);
    pAVar2 = std::_List_iterator<argparse::Argument>::operator*(&ppVar4->second);
    return pAVar2;
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  bVar1 = is_valid_prefix_char(this,*pvVar3);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_58,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_59);
    std::allocator<char>::~allocator(&local_59);
    __c = get_any_valid_prefix_char(this);
    prefix.field_2._M_local_buf[0xb] = __c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_90,1,__c,&local_91);
    std::allocator<char>::~allocator(&local_91);
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    local_d0 = (key_type)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_c0 = (_Base_ptr)
               std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
               ::find(&this->m_argument_map,&local_d0);
    local_30._M_node = local_c0;
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
         ::end(&this->m_argument_map);
    bVar1 = std::operator!=(&local_30,&local_d8);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
               ::operator->(&local_30);
      arg_name_local._M_str =
           (char *)std::_List_iterator<argparse::Argument>::operator*(&ppVar4->second);
      local_dc = 1;
    }
    else {
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      local_118 = (key_type)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
      local_108 = (_Base_ptr)
                  std::
                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                  ::find(&this->m_argument_map,&local_118);
      local_30._M_node = local_108;
      local_120._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::end(&this->m_argument_map);
      bVar1 = std::operator!=(&local_30,&local_120);
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                 ::operator->(&local_30);
        arg_name_local._M_str =
             (char *)std::_List_iterator<argparse::Argument>::operator*(&ppVar4->second);
        local_dc = 1;
      }
      else {
        local_dc = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_58);
    if (local_dc != 0) {
      return (Argument *)arg_name_local._M_str;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_160,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_161);
  std::operator+(&local_140,"No such argument: ",&local_160);
  std::logic_error::logic_error(this_00,(string *)&local_140);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Argument &operator[](std::string_view arg_name) const {
    auto it = m_argument_map.find(arg_name);
    if (it != m_argument_map.end()) {
      return *(it->second);
    }
    if (!is_valid_prefix_char(arg_name.front())) {
      std::string name(arg_name);
      const auto legal_prefix_char = get_any_valid_prefix_char();
      const auto prefix = std::string(1, legal_prefix_char);

      // "-" + arg_name
      name = prefix + name;
      it = m_argument_map.find(name);
      if (it != m_argument_map.end()) {
        return *(it->second);
      }
      // "--" + arg_name
      name = prefix + name;
      it = m_argument_map.find(name);
      if (it != m_argument_map.end()) {
        return *(it->second);
      }
    }
    throw std::logic_error("No such argument: " + std::string(arg_name));
  }